

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

string * __thiscall
llvm::Triple::merge_abi_cxx11_(string *__return_storage_ptr__,Triple *this,Triple *Other)

{
  bool bVar1;
  
  if (this->Vendor == Apple) {
    bVar1 = isOSVersionLT(Other,this);
    if (bVar1) goto LAB_0019111f;
  }
  this = Other;
LAB_0019111f:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Triple::merge(const Triple &Other) const {
  // If vendor is apple, pick the triple with the larger version number.
  if (getVendor() == Triple::Apple)
    if (Other.isOSVersionLT(*this))
      return str();

  return Other.str();
}